

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O2

shared_ptr<Bird> __thiscall
cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>::createInstance
          (InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_> *this,
          InjectionContext *context)

{
  InjectionContext *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Bird> sVar1;
  ContextGuard guard;
  allocator local_91;
  string local_90;
  undefined1 local_70 [40];
  ContextGuard local_48;
  
  if (context[1].componentStack_.
      super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    std::__cxx11::string::string((string *)&local_90,"Snake",&local_91);
  }
  else {
    std::__cxx11::string::string((string *)&local_90,(string *)(context + 1));
  }
  make_component_type<Bird>((component_type *)local_70,&local_90);
  ContextGuard::ContextGuard(&local_48,in_RDX,(component_type *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  std::__cxx11::string::~string((string *)&local_90);
  ContextGuard::ensureNoCycle(&local_48);
  ConstructorInvoker<Bird_(std::shared_ptr<Legs>,_std::shared_ptr<Wings>,_std::shared_ptr<Behavior>,_std::shared_ptr<WaterPool>)>
  ::invoke((ConstructorInvoker<Bird_(std::shared_ptr<Legs>,_std::shared_ptr<Wings>,_std::shared_ptr<Behavior>,_std::shared_ptr<WaterPool>)>
            *)this,in_RDX);
  ContextGuard::~ContextGuard(&local_48);
  sVar1.super___shared_ptr<Bird,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Bird,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Bird>)sVar1.super___shared_ptr<Bird,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TImplementation> createInstance(InjectionContext* context)
    {
        ContextGuard guard(context, make_component_type<TImplementation>(!name_.empty() ? name_ : type_name<TImplementation>::value()));

        guard.ensureNoCycle();

        return factory_.createInstance(context);
    }